

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.capnp.h
# Opt level: O2

Builder * __thiscall
capnp::compiler::Statement::Builder::initBlock
          (Builder *__return_storage_ptr__,Builder *this,uint size)

{
  PointerBuilder local_28;
  
  *(undefined2 *)(this->_builder).data = 1;
  local_28.pointer = (this->_builder).pointers + 1;
  local_28.segment = (this->_builder).segment;
  local_28.capTable = (this->_builder).capTable;
  capnp::_::PointerBuilder::initStructList
            (&__return_storage_ptr__->builder,&local_28,size,(StructSize)0x30002);
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnp::List< ::capnp::compiler::Statement,  ::capnp::Kind::STRUCT>::Builder Statement::Builder::initBlock(unsigned int size) {
  _builder.setDataField<Statement::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Statement::BLOCK);
  return ::capnp::_::PointerHelpers< ::capnp::List< ::capnp::compiler::Statement,  ::capnp::Kind::STRUCT>>::init(_builder.getPointerField(
      ::capnp::bounded<1>() * ::capnp::POINTERS), size);
}